

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.h
# Opt level: O2

Pointer __thiscall
snestistics::AnnotationResolver::find_last_free_after_or_at
          (AnnotationResolver *this,Pointer p,Pointer stop)

{
  uint uVar1;
  pointer pAVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = 0;
  do {
    uVar1 = p + iVar5;
    if (stop < uVar1) {
      return stop;
    }
    if (uVar1 < (uint)(this->_annotation_for_adress)._size) {
      piVar3 = Array<int>::operator[](&this->_annotation_for_adress,(ulong)uVar1);
      lVar4 = (long)*piVar3;
      if (lVar4 != -1) {
        pAVar2 = (this->_annotations).
                 super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pAVar2[lVar4].type - ANNOTATION_FUNCTION < 2) {
          if (iVar5 != 0) {
            return pAVar2[lVar4].startOfRange - 1;
          }
          return 0xffffffff;
        }
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

Pointer find_last_free_after_or_at(Pointer p, Pointer stop) const {

		// Assume in same bank
		for (uint32_t i = p; i <= stop; i++) {
			if (i >= _annotation_for_adress.size())
				continue;
			int ai = _annotation_for_adress[i];
			if (ai == -1)
				continue;
			const Annotation &a = _annotations[ai];
			if (a.type == ANNOTATION_FUNCTION || a.type == ANNOTATION_DATA) {
				if (i==p)
					return INVALID_POINTER; // No valid
				return a.startOfRange-1; // Min here if we stared in a function
			}
		}
		return stop;
	}